

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

void __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
IEnumerableCore(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
                *this,GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>
                      *source)

{
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *source_local;
  IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
  *this_local;
  
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::GroupByState
            (&this->source,source);
  return;
}

Assistant:

IEnumerableCore(S&& source) 
			: source(source) 
		{ }